

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::erase
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,Bucket bucket)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  size_t to;
  Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this_00;
  long in_FS_OFFSET;
  Bucket local_50;
  Bucket local_40;
  long local_30;
  
  local_40.index = bucket.index;
  local_40.span = bucket.span;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (local_40.span)->offsets[local_40.index];
  (local_40.span)->offsets[local_40.index] = 0xff;
  (local_40.span)->entries[bVar1].storage.data[0] = (local_40.span)->nextFree;
  (local_40.span)->nextFree = bVar1;
  this->size = this->size - 1;
  to = local_40.index;
  this_00 = local_40.span;
  do {
    Bucket::advanceWrapped(&local_40,this);
    if ((ulong)(local_40.span)->offsets[local_40.index] == 0xff) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
        __stack_chk_fail();
      }
      return;
    }
    sVar2 = calculateHash<int>((int *)((local_40.span)->entries +
                                      (local_40.span)->offsets[local_40.index]),this->seed);
    uVar3 = this->numBuckets - 1 & sVar2;
    local_50.span = this->spans + (uVar3 >> 7);
    local_50.index = (size_t)((uint)uVar3 & 0x7f);
    while (local_50.index != local_40.index || local_50.span != local_40.span) {
      if ((local_50.span == this_00) && (local_50.index == to)) {
        if (local_40.span == this_00) {
          this_00->offsets[to] = this_00->offsets[local_40.index];
          this_00->offsets[local_40.index] = 0xff;
          to = local_40.index;
          this_00 = local_40.span;
        }
        else {
          Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::moveFromSpan
                    (this_00,local_40.span,local_40.index,to);
          to = local_40.index;
          this_00 = local_40.span;
        }
        break;
      }
      Bucket::advanceWrapped(&local_50,this);
    }
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }